

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool ReadASC(string *ASCPath,VecVector3d *Accel,VecVector3d *Gyro)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  istream *piVar4;
  double *pdVar5;
  int week;
  uint local_458;
  int status;
  string line;
  Scalar local_430;
  double SOW;
  string head;
  Vector3d gyro;
  Vector3d accel;
  ifstream ASCFile;
  uint auStack_3a0 [122];
  stringstream buff;
  ostream local_1a8 [376];
  
  std::ifstream::ifstream((string *)&ASCFile);
  std::ifstream::open((string *)&ASCFile,(_Ios_Openmode)ASCPath);
  lVar3 = *(long *)(_ASCFile + -0x18);
  local_458 = *(uint *)((long)auStack_3a0 + lVar3);
  if ((local_458 & 5) == 0) {
    while ((*(byte *)((long)auStack_3a0 + lVar3) & 2) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream((stringstream *)&buff);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ASCFile,(string *)&line);
      head._M_dataplus._M_p._0_1_ = 0x2c;
      gyro.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0].
      _0_1_ = 0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )line._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(line._M_dataplus._M_p + line._M_string_length),(char *)&head,(char *)&gyro);
      head._M_dataplus._M_p._0_1_ = 0x3b;
      gyro.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0].
      _0_1_ = 0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )line._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(line._M_dataplus._M_p + line._M_string_length),(char *)&head,(char *)&gyro);
      head._M_dataplus._M_p._0_1_ = 0x2a;
      gyro.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0].
      _0_1_ = 0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )line._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(line._M_dataplus._M_p + line._M_string_length),(char *)&head,(char *)&gyro);
      std::operator<<(local_1a8,(string *)&line);
      head._M_dataplus._M_p = (pointer)&head.field_2;
      head._M_string_length = 0;
      head.field_2._M_local_buf[0] = '\0';
      piVar4 = std::operator>>((istream *)&buff,(string *)&head);
      pdVar5 = (double *)std::istream::operator>>(piVar4,&week);
      piVar4 = std::istream::_M_extract<double>(pdVar5);
      pdVar5 = (double *)std::istream::operator>>(piVar4,&week);
      piVar4 = std::istream::_M_extract<double>(pdVar5);
      pdVar5 = (double *)std::istream::operator>>(piVar4,&status);
      piVar4 = std::istream::_M_extract<double>(pdVar5);
      piVar4 = std::istream::_M_extract<double>((double *)piVar4);
      piVar4 = std::istream::_M_extract<double>((double *)piVar4);
      piVar4 = std::istream::_M_extract<double>((double *)piVar4);
      piVar4 = std::istream::_M_extract<double>((double *)piVar4);
      std::istream::_M_extract<double>((double *)piVar4);
      accel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           -accel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      if (status != 0x4d) {
        poVar2 = std::operator<<((ostream *)&std::cout,"observations are not operable!\n");
        poVar2 = std::operator<<(poVar2,"time: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,week);
        std::operator<<(poVar2,", ");
        poVar2 = std::ostream::_M_insert<double>(SOW);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      local_430 = 1.52587890625e-06;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
                ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&accel,&local_430);
      local_430 = 1.0850694444444445e-07;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
                ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&gyro,&local_430);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back(Accel,(value_type *)&accel);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back(Gyro,(value_type *)&gyro);
      std::__cxx11::string::~string((string *)&head);
      std::__cxx11::stringstream::~stringstream((stringstream *)&buff);
      std::__cxx11::string::~string((string *)&line);
      lVar3 = *(long *)(_ASCFile + -0x18);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"open error!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar1 = local_458 & 5;
  std::ifstream::~ifstream(&ASCFile);
  return uVar1 == 0;
}

Assistant:

bool ReadASC(string ASCPath, VecVector3d &Accel, VecVector3d &Gyro)
{
    ifstream ASCFile;
    ASCFile.open(ASCPath);
    if(!ASCFile)
    {
        cerr << "open error!" << endl;
        return false;
    }

    while(!ASCFile.eof())
    {
        /* 去标点处理 */
        string line;
        stringstream buff;
        getline(ASCFile, line);
        replace(line.begin(), line.end(), ',', ' ');
        replace(line.begin(), line.end(), ';', ' ');
        replace(line.begin(), line.end(), '*', ' ');
        buff << line;

        /* 数据存入内存 */
        Vector3d gyro, accel;
        /* 本次实验暂时未使用 */
        int week, status;
        double SOW;
        string head;
        buff >> head >> week >> SOW >> week >> SOW >> status >> accel[2] >> accel[1] >> accel[0]
             >> gyro[2] >> gyro[1] >> gyro[0];
        /* Y轴的输出是加了一个负号 */
        accel[1] = -accel[1];
        
        if(status != 77)
            cout << "observations are not operable!\n" << "time: " << week << ", " << SOW << endl;
            
        accel *= ACCEL_SCALE;
        gyro *= GYRO_SCALE;
        Accel.push_back(accel);
        Gyro.push_back(gyro);
    }
    
    return true;
}